

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *this;
  ImVec2 cr_min;
  undefined4 uVar5;
  undefined4 uVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  ImU32 col;
  ImGuiContext *pIVar9;
  float fVar10;
  ImVec2 cr_max;
  float fVar11;
  ImVec2 local_58;
  ImVec2 IStack_50;
  ImVec4 local_48;
  
  pIVar7 = GImGui;
  if (GImGui->DragDropActive == false) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x23c2,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  if ((GImGui->DragDropPayload).DataFrameCount == -1) {
    __assert_fail("payload.DataFrameCount != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x23c3,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  pIVar4 = GImGui->CurrentWindow;
  if ((type == (char *)0x0) || (iVar8 = strcmp(type,(GImGui->DragDropPayload).DataType), iVar8 == 0)
     ) {
    IVar2 = pIVar7->DragDropTargetId;
    IVar3 = pIVar7->DragDropAcceptIdPrev;
    local_58 = (pIVar7->DragDropTargetRect).Min;
    IStack_50 = (pIVar7->DragDropTargetRect).Max;
    fVar11 = (IStack_50.y - local_58.y) * (IStack_50.x - local_58.x);
    if (fVar11 < pIVar7->DragDropAcceptIdCurrRectSurface) {
      pIVar7->DragDropAcceptFlags = flags;
      pIVar7->DragDropAcceptIdCurr = IVar2;
      pIVar7->DragDropAcceptIdCurrRectSurface = fVar11;
    }
    (pIVar7->DragDropPayload).Preview = IVar3 == IVar2;
    if (((pIVar7->DragDropSourceFlags | flags) & 0x800U) == 0 && IVar3 == IVar2) {
      fVar11 = local_58.x + -3.5;
      local_58.y = local_58.y + -3.5;
      fVar10 = IStack_50.x + 3.5;
      IStack_50.y = IStack_50.y + 3.5;
      local_58.x = fVar11;
      IStack_50.x = fVar10;
      if ((((fVar11 < (pIVar4->ClipRect).Min.x) || (local_58.y < (pIVar4->ClipRect).Min.y)) ||
          ((pIVar4->ClipRect).Max.x < fVar10)) ||
         (bVar1 = true, pIVar9 = pIVar7, (pIVar4->ClipRect).Max.y < IStack_50.y)) {
        cr_max.x = fVar10 + 1.0;
        cr_max.y = IStack_50.y + 1.0;
        bVar1 = false;
        cr_min.y = local_58.y + -1.0;
        cr_min.x = fVar11 + -1.0;
        ImDrawList::PushClipRect(pIVar4->DrawList,cr_min,cr_max,false);
        pIVar9 = GImGui;
      }
      this = pIVar4->DrawList;
      local_48.x = (pIVar9->Style).Colors[0x2b].x;
      local_48.y = (pIVar9->Style).Colors[0x2b].y;
      uVar5 = (pIVar9->Style).Colors[0x2b].z;
      uVar6 = (pIVar9->Style).Colors[0x2b].w;
      local_48.w = (pIVar9->Style).Alpha * (float)uVar6;
      local_48.z = (float)uVar5;
      col = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(this,&local_58,&IStack_50,col,0.0,-1,2.0);
      if (!bVar1) {
        ImDrawList::PopClipRect(pIVar4->DrawList);
      }
    }
    pIVar7->DragDropAcceptFrameCount = pIVar7->FrameCount;
    if (IVar3 == IVar2) {
      if (4 < (ulong)(uint)pIVar7->DragDropMouseButton) {
        __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*g.IO.MouseDown)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0x1100,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
      }
      bVar1 = (GImGui->IO).MouseDown[(uint)pIVar7->DragDropMouseButton];
      (pIVar7->DragDropPayload).Delivery = (bool)(bVar1 ^ 1);
      if ((((uint)flags >> 10 & 1) != 0) || (bVar1 == false)) {
LAB_001e6603:
        return &pIVar7->DragDropPayload;
      }
    }
    else {
      (pIVar7->DragDropPayload).Delivery = false;
      if (((uint)flags >> 10 & 1) != 0) goto LAB_001e6603;
    }
  }
  return (ImGuiPayload *)0x0;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface < g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
    {
        // FIXME-DRAG: Settle on a proper default visuals for drop target.
        r.Expand(3.5f);
        bool push_clip_rect = !window->ClipRect.Contains(r);
        if (push_clip_rect) window->DrawList->PushClipRect(r.Min-ImVec2(1,1), r.Max+ImVec2(1,1));
        window->DrawList->AddRect(r.Min, r.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, ~0, 2.0f);
        if (push_clip_rect) window->DrawList->PopClipRect();
    }

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}